

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int traverseephemeron(global_State *g,Table *h,int inv)

{
  Node *pNVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  GCObject *pGVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  int local_48;
  
  uVar4 = luaH_realasize(h);
  uVar8 = 1L << (h->lsizenode & 0x3f);
  bVar3 = false;
  local_48 = 0;
  if (uVar4 != 0) {
    lVar10 = 0;
    local_48 = 0;
    do {
      if ((((&h->array->tt_)[lVar10] & 0x40) != 0) &&
         (pGVar7 = *(GCObject **)((long)&h->array->value_ + lVar10), (pGVar7->marked & 0x18) != 0))
      {
        reallymarkobject(g,pGVar7);
        local_48 = 1;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar10);
  }
  uVar4 = (uint)uVar8;
  uVar9 = 0;
  bVar2 = false;
  do {
    uVar4 = uVar4 - 1;
    uVar6 = (ulong)uVar4;
    if (inv == 0) {
      uVar6 = uVar9;
    }
    pNVar1 = h->node + uVar6;
    bVar11 = (pNVar1->u).key_tt & 0x40;
    if (((pNVar1->u).tt_ & 0xf) == 0) {
      if (bVar11 != 0) {
        (pNVar1->u).key_tt = '\v';
      }
    }
    else {
      if (bVar11 == 0) {
        pGVar7 = (GCObject *)0x0;
      }
      else {
        pGVar7 = (pNVar1->u).key_val.gc;
      }
      iVar5 = iscleared(g,pGVar7);
      if (iVar5 == 0) {
        if ((((pNVar1->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar1)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar1);
          local_48 = 1;
        }
      }
      else {
        bVar3 = true;
        if ((((pNVar1->u).tt_ & 0x40) != 0) &&
           (bVar3 = true, (((pNVar1->u).value_.gc)->marked & 0x18) != 0)) {
          bVar2 = true;
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar9);
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar2) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar3) {
      genlink(g,(GCObject *)h);
      return local_48;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_48;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int asize = luaH_realasize(h);
  unsigned int nsize = sizenode(h);
  /* traverse array part */
  for (i = 0; i < asize; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}